

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytree.c
# Opt level: O2

tommy_tree_node * tommy_tree_search_node(undefined1 *cmp,tommy_tree_node *root,void *data)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (; root != (tommy_tree_node *)0x0; root = root->next) {
    iVar2 = (*(code *)cmp)(data,root->data);
    if (iVar2 < 0) {
      root = (tommy_tree_node *)&root->prev;
    }
    else if (iVar2 == 0) break;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return root;
}

Assistant:

static tommy_tree_node* tommy_tree_search_node(tommy_compare_func* cmp, tommy_tree_node* root, void* data)
{
	int c;

	if (!root)
		return 0;

	c = cmp(data, root->data);

	if (c < 0)
		return tommy_tree_search_node(cmp, root->prev, data);

	if (c > 0)
		return tommy_tree_search_node(cmp, root->next, data);

	return root;
}